

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBoxPrivate::editorTextChanged(QAbstractSpinBoxPrivate *this,QString *t)

{
  EmitPolicy ep;
  QAbstractSpinBox *val;
  QAbstractSpinBoxPrivate *in_RSI;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  State state;
  QAbstractSpinBox *q;
  int pos;
  QString tmp;
  QVariant v;
  QString *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff9b;
  int local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  val = q_func(in_RDI);
  if ((*(ushort *)&in_RDI->field_0x3d0 >> 6 & 1) == 0) {
    *(ushort *)&in_RDI->field_0x3d0 = *(ushort *)&in_RDI->field_0x3d0 & 0xfffe | 1;
  }
  else {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_RDI,in_stack_ffffffffffffff88);
    local_44 = QLineEdit::cursorPosition((QLineEdit *)in_RDI);
    ep = (**(code **)(*(long *)&val->super_QWidget + 0x1a0))(val,&local_40,&local_44);
    if (ep == NeverEmit) {
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0xe0))(&local_28,in_RDI,&local_40);
      ::operator!=((QString *)in_RDI,in_stack_ffffffffffffff88);
      setValue(in_RSI,(QVariant *)val,ep,(bool)in_stack_ffffffffffffff9b);
      *(ushort *)&in_RDI->field_0x3d0 = *(ushort *)&in_RDI->field_0x3d0 & 0xfffe;
      ::QVariant::~QVariant((QVariant *)&local_28);
    }
    else {
      *(ushort *)&in_RDI->field_0x3d0 = *(ushort *)&in_RDI->field_0x3d0 & 0xfffe | 1;
    }
    QString::~QString((QString *)0x6870e2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::editorTextChanged(const QString &t)
{
    Q_Q(QAbstractSpinBox);

    if (keyboardTracking) {
        QString tmp = t;
        int pos = edit->cursorPosition();
        QValidator::State state = q->validate(tmp, pos);
        if (state == QValidator::Acceptable) {
            const QVariant v = valueFromText(tmp);
            setValue(v, EmitIfChanged, tmp != t);
            pendingEmit = false;
        } else {
            pendingEmit = true;
        }
    } else {
        pendingEmit = true;
    }
}